

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O2

optional_idx __thiscall duckdb::NameMapper::Find(NameMapper *this,MultiFileColumnDefinition *column)

{
  const_iterator cVar1;
  optional_idx local_38;
  string local_30;
  
  MultiFileColumnDefinition::GetIdentifierName_abi_cxx11_(&local_30,column);
  cVar1 = ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->name_map)._M_h,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>,_true>
      ._M_cur == (__node_type *)0x0) {
    local_38.index = 0xffffffffffffffff;
  }
  else {
    optional_idx::optional_idx
              (&local_38,
               *(idx_t *)((long)cVar1.
                                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>,_true>
                                ._M_cur + 0x28));
  }
  return (optional_idx)local_38.index;
}

Assistant:

optional_idx Find(const MultiFileColumnDefinition &column) const override {
		auto entry = name_map.find(column.GetIdentifierName());
		if (entry == name_map.end()) {
			return optional_idx();
		}
		return entry->second.GetId();
	}